

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

void Acb_PrintPatch(Acb_Ntk_t *pNtkF,Vec_Int_t *vDivs,Vec_Int_t *vUsed,abctime clk)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  int level;
  long lVar7;
  long lVar8;
  timespec ts;
  timespec local_40;
  
  uVar6 = 0;
  printf("Patch has %d inputs: ",(ulong)(uint)vUsed->nSize);
  if (0 < vUsed->nSize) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar1 = vUsed->pArray[lVar7];
      if (((long)(int)uVar1 < 0) || (vDivs->nSize <= (int)uVar1)) {
LAB_0039ba2a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vDivs->pArray[(int)uVar1];
      lVar8 = (long)(int)uVar2;
      if (lVar8 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
      }
      uVar3 = (pNtkF->vObjName).nSize;
      if ((int)uVar3 < 1) {
        __assert_fail("Acb_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
      }
      if (uVar3 <= uVar2) goto LAB_0039ba2a;
      pcVar5 = Abc_NamStr(pNtkF->pDesign->pStrs,(pNtkF->vObjName).pArray[lVar8]);
      uVar3 = (pNtkF->vObjWeight).nSize;
      if ((int)uVar3 < 1) {
LAB_0039ba49:
        __assert_fail("Acb_NtkHasObjWeights(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x10a,"int Acb_ObjWeight(Acb_Ntk_t *, int)");
      }
      if (uVar3 <= uVar2) goto LAB_0039ba2a;
      printf("%d=%s(w=%d) ",(ulong)uVar1,pcVar5,(ulong)(uint)(pNtkF->vObjWeight).pArray[lVar8]);
      uVar1 = (pNtkF->vObjWeight).nSize;
      if ((int)uVar1 < 1) goto LAB_0039ba49;
      if (uVar1 <= uVar2) goto LAB_0039ba2a;
      uVar6 = uVar6 + (pNtkF->vObjWeight).pArray[lVar8];
      lVar7 = lVar7 + 1;
    } while (lVar7 < vUsed->nSize);
  }
  printf("\nTotal weight = %d  ",(ulong)uVar6);
  level = 3;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Total runtime");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar7 - clk) / 1000000.0);
  putchar(10);
  return;
}

Assistant:

void Acb_PrintPatch( Acb_Ntk_t * pNtkF, Vec_Int_t * vDivs, Vec_Int_t * vUsed, abctime clk )
{
    int i, iObj, Weight = 0;
    printf( "Patch has %d inputs: ", Vec_IntSize(vUsed) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
    {
        printf( "%d=%s(w=%d) ", Vec_IntEntry(vUsed, i), Acb_ObjNameStr(pNtkF, iObj), Acb_ObjWeight(pNtkF, iObj) );
        Weight += Acb_ObjWeight(pNtkF, iObj);
    }
    printf( "\nTotal weight = %d  ", Weight );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    printf( "\n" );
}